

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O2

void __thiscall
capnp::RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::
RpcSystem<capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
          (RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *this,
          VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
          *network,Maybe<capnp::Capability::Client> *bootstrap)

{
  NullableValue<capnp::Capability::Client> local_30;
  
  kj::Maybe<capnp::Capability::Client>::Maybe
            ((Maybe<capnp::Capability::Client> *)&local_30,bootstrap);
  capnp::_::RpcSystemBase::RpcSystemBase
            (&this->super_RpcSystemBase,&network->super_VatNetworkBase,
             (Maybe<capnp::Capability::Client> *)&local_30);
  kj::_::NullableValue<capnp::Capability::Client>::~NullableValue(&local_30);
  return;
}

Assistant:

RpcSystem<VatId>::RpcSystem(
      VatNetwork<VatId, ThirdPartyCompletion, ThirdPartyToAwait, ThirdPartyToContact,
                 JoinResult>& network,
      kj::Maybe<Capability::Client> bootstrap)
    : _::RpcSystemBase(network, kj::mv(bootstrap)) {}